

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeFenceQueryStatus(ze_fence_handle_t hFence)

{
  ze_pfnFenceQueryStatus_t pfnQueryStatus;
  ze_result_t result;
  ze_fence_handle_t hFence_local;
  
  pfnQueryStatus._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c580 != (code *)0x0) {
    pfnQueryStatus._4_4_ = (*DAT_0011c580)(hFence);
  }
  return pfnQueryStatus._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFenceQueryStatus(
        ze_fence_handle_t hFence                        ///< [in] handle of the fence
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnQueryStatus = context.zeDdiTable.Fence.pfnQueryStatus;
        if( nullptr != pfnQueryStatus )
        {
            result = pfnQueryStatus( hFence );
        }
        else
        {
            // generic implementation
        }

        return result;
    }